

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

TRexBool trex_searchrange(TRex *exp,char *text_begin,char *text_end,char **out_begin,char **out_end)

{
  char *pcVar1;
  char *str;
  TRexBool TVar2;
  int iVar3;
  char *pcVar4;
  TRexNode *pTVar5;
  
  if (text_begin < text_end) {
    iVar3 = exp->_first;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
      pcVar4 = text_begin;
      if (iVar3 == -1) {
        iVar3 = -1;
        pcVar1 = pcVar4;
      }
      else {
        pTVar5 = exp->_nodes;
        str = pcVar4;
        while( true ) {
          exp->_currsubexp = 0;
          str = trex_matchnode(exp,pTVar5 + iVar3,str,(TRexNode *)0x0);
          pcVar1 = (char *)0x0;
          if (str == (char *)0x0) break;
          pTVar5 = exp->_nodes;
          iVar3 = pTVar5[iVar3].next;
          if (iVar3 == -1) goto LAB_00106ac1;
        }
      }
      str = pcVar1;
    } while ((str == (char *)0x0) && (text_begin = pcVar4 + 1, pcVar4 + 1 != text_end));
    if (str == (char *)0x0) {
      TVar2 = 0;
    }
    else {
LAB_00106ac1:
      if (out_begin != (char **)0x0) {
        *out_begin = pcVar4;
      }
      TVar2 = 1;
      if (out_end != (char **)0x0) {
        *out_end = str;
      }
    }
  }
  else {
    TVar2 = 0;
  }
  return TVar2;
}

Assistant:

TRexBool trex_searchrange(TRex * exp, const TRexChar * text_begin, const TRexChar * text_end, const TRexChar ** out_begin, const TRexChar ** out_end) {
	const TRexChar * cur = NULL;
	int node = exp->_first;

	if (text_begin >= text_end) {
		return TRex_False;
	}

	exp->_bol = text_begin;
	exp->_eol = text_end;

	do {
		cur = text_begin;

		while (node != -1) {
			exp->_currsubexp = 0;
			cur = trex_matchnode(exp, &exp->_nodes[node], cur, NULL);

			if (!cur) {
				break;
			}

			node = exp->_nodes[node].next;
		}

		text_begin++;
	} while (cur == NULL && text_begin != text_end);

	if (cur == NULL) {
		return TRex_False;
	}

	--text_begin;

	if (out_begin) {
		*out_begin = text_begin;
	}

	if (out_end) {
		*out_end = cur;
	}

	return TRex_True;
}